

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O1

RK_U32 mpp_frame_get_fbc_offset(MppFrame frame)

{
  MPP_RET MVar1;
  RK_U32 RVar2;
  uint uVar3;
  uint uVar4;
  
  MVar1 = _check_is_mpp_frame("mpp_frame_get_fbc_offset",frame);
  RVar2 = 0;
  if (MVar1 == MPP_OK) {
    uVar4 = *(uint *)((long)frame + 0x68) & 0xf00000;
    if (uVar4 != 0) {
      uVar3 = 0;
      if (uVar4 == 0x100000) {
        uVar3 = ((*(int *)((long)frame + 0xc) + 0xfU & 0xffffff0) *
                 (*(int *)((long)frame + 8) + 0xfU & 0xfffffff0) >> 4) + 0xfff & 0x1ffff000;
      }
      *(uint *)((long)frame + 0xc0) = uVar3;
    }
    RVar2 = *(RK_U32 *)((long)frame + 0xc0);
  }
  return RVar2;
}

Assistant:

RK_U32 mpp_frame_get_fbc_offset(MppFrame frame)
{
    if (check_is_mpp_frame(frame))
        return 0;

    MppFrameImpl *p = (MppFrameImpl *)frame;

    if (MPP_FRAME_FMT_IS_FBC(p->fmt)) {
        RK_U32 fbc_version = p->fmt & MPP_FRAME_FBC_MASK;
        RK_U32 fbc_offset = 0;

        if (fbc_version == MPP_FRAME_FBC_AFBC_V1) {
            fbc_offset = MPP_ALIGN(MPP_ALIGN(p->width, 16) *
                                   MPP_ALIGN(p->height, 16) / 16, SZ_4K);
        } else if (fbc_version == MPP_FRAME_FBC_AFBC_V2 ||
                   fbc_version == MPP_FRAME_FBC_RKFBC) {
            fbc_offset = 0;
        }
        p->fbc_offset = fbc_offset;
    }

    return p->fbc_offset;
}